

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

wchar_t el_wparse(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *__dest;
  long lVar4;
  anon_struct_16_2_3f885e32 *paVar5;
  long lVar6;
  wchar_t *__wcs;
  
  if (argc < L'\x01') {
    return L'\xffffffff';
  }
  __wcs = *argv;
  pwVar3 = wcschr(__wcs,L':');
  if (pwVar3 != (wchar_t *)0x0) {
    lVar6 = (long)pwVar3 - (long)__wcs;
    if (lVar6 == 0) {
      return L'\0';
    }
    __dest = (wchar_t *)calloc((lVar6 >> 2) + 1,4);
    if (__dest == (wchar_t *)0x0) {
      return L'\0';
    }
    wcsncpy(__dest,__wcs,lVar6 >> 2);
    *(undefined4 *)((long)__dest + lVar6) = 0;
    wVar1 = el_match(el->el_prog,__dest);
    free(__dest);
    if (wVar1 == L'\0') {
      return L'\0';
    }
    __wcs = pwVar3 + 1;
  }
  iVar2 = wcscmp(anon_var_dwarf_3dfa,__wcs);
  if (iVar2 == 0) {
    paVar5 = cmds;
  }
  else {
    lVar6 = 0;
    do {
      lVar4 = lVar6;
      if (lVar4 + 0x10 == 0x70) {
        return L'\xffffffff';
      }
      iVar2 = wcscmp(*(wchar_t **)((long)&cmds[1].name + lVar4),__wcs);
      lVar6 = lVar4 + 0x10;
    } while (iVar2 != 0);
    paVar5 = (anon_struct_16_2_3f885e32 *)(lVar4 + 0x1264e0);
  }
  wVar1 = (*paVar5->func)(el,argc,argv);
  return -wVar1;
}

Assistant:

int
el_wparse(EditLine *el, int argc, const wchar_t *argv[])
{
	const wchar_t *ptr;
	int i;

	if (argc < 1)
		return -1;
	ptr = wcschr(argv[0], L':');
	if (ptr != NULL) {
		wchar_t *tprog;
		size_t l;

		if (ptr == argv[0])
			return 0;
		l = (size_t)(ptr - argv[0]);
		tprog = el_calloc(l + 1, sizeof(*tprog));
		if (tprog == NULL)
			return 0;
		(void) wcsncpy(tprog, argv[0], l);
		tprog[l] = '\0';
		ptr++;
		l = (size_t)el_match(el->el_prog, tprog);
		el_free(tprog);
		if (!l)
			return 0;
	} else
		ptr = argv[0];

	for (i = 0; cmds[i].name != NULL; i++)
		if (wcscmp(cmds[i].name, ptr) == 0) {
			i = (*cmds[i].func) (el, argc, argv);
			return -i;
		}
	return -1;
}